

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 Jx9CoreConfigure(sxi32 nOp,__va_list_tag *ap)

{
  uint uVar1;
  undefined8 *local_b8;
  undefined8 *local_a0;
  undefined8 *local_88;
  undefined8 *local_70;
  void *pUserData;
  ProcMemError xMemErr_1;
  void *pMemErr;
  ProcMemError xMemErr;
  SyMemMethods *pMethods;
  jx9_vfs *pVfs;
  int rc;
  __va_list_tag *ap_local;
  sxi32 nOp_local;
  
  pVfs._4_4_ = 0;
  switch(nOp) {
  case 1:
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_88 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_88 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_88 + 1;
    }
    if ((SyMemMethods *)*local_88 == (SyMemMethods *)0x0) {
      pVfs._4_4_ = SyMemBackendInit(&sJx9MPGlobal.sAllocator,sJx9MPGlobal.sAllocator.xMemError,
                                    sJx9MPGlobal.sAllocator.pUserData);
    }
    else {
      pVfs._4_4_ = SyMemBackendInitFromOthers
                             (&sJx9MPGlobal.sAllocator,(SyMemMethods *)*local_88,
                              sJx9MPGlobal.sAllocator.xMemError,sJx9MPGlobal.sAllocator.pUserData);
    }
    break;
  case 2:
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_a0 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_a0 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_a0 + 1;
    }
    sJx9MPGlobal.sAllocator.xMemError = (ProcMemError)*local_a0;
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_b8 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_b8 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_b8 + 1;
    }
    sJx9MPGlobal.sAllocator.pUserData = (void *)*local_b8;
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    break;
  case 6:
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_70 = (undefined8 *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_70 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_70 + 1;
    }
    sJx9MPGlobal.pVfs = (jx9_vfs *)*local_70;
    break;
  default:
    pVfs._4_4_ = -0x18;
  }
  return pVfs._4_4_;
}

Assistant:

static sxi32 Jx9CoreConfigure(sxi32 nOp, va_list ap)
{
	int rc = JX9_OK;
	switch(nOp){
	    case JX9_LIB_CONFIG_VFS:{
			/* Install a virtual file system */
			const jx9_vfs *pVfs = va_arg(ap, const jx9_vfs *);
			sJx9MPGlobal.pVfs = pVfs;
			break;
								}
		case JX9_LIB_CONFIG_USER_MALLOC: {
			/* Use an alternative low-level memory allocation routines */
			const SyMemMethods *pMethods = va_arg(ap, const SyMemMethods *);
			/* Save the memory failure callback (if available) */
			ProcMemError xMemErr = sJx9MPGlobal.sAllocator.xMemError;
			void *pMemErr = sJx9MPGlobal.sAllocator.pUserData;
			if( pMethods == 0 ){
				/* Use the built-in memory allocation subsystem */
				rc = SyMemBackendInit(&sJx9MPGlobal.sAllocator, xMemErr, pMemErr);
			}else{
				rc = SyMemBackendInitFromOthers(&sJx9MPGlobal.sAllocator, pMethods, xMemErr, pMemErr);
			}
			break;
										  }
		case JX9_LIB_CONFIG_MEM_ERR_CALLBACK: {
			/* Memory failure callback */
			ProcMemError xMemErr = va_arg(ap, ProcMemError);
			void *pUserData = va_arg(ap, void *);
			sJx9MPGlobal.sAllocator.xMemError = xMemErr;
			sJx9MPGlobal.sAllocator.pUserData = pUserData;
			break;
												 }	  
		case JX9_LIB_CONFIG_USER_MUTEX: {
#if defined(JX9_ENABLE_THREADS)
			/* Use an alternative low-level mutex subsystem */
			const SyMutexMethods *pMethods = va_arg(ap, const SyMutexMethods *);
#if defined (UNTRUST)
			if( pMethods == 0 ){
				rc = JX9_CORRUPT;
			}
#endif
			/* Sanity check */
			if( pMethods->xEnter == 0 || pMethods->xLeave == 0 || pMethods->xNew == 0){
				/* At least three criticial callbacks xEnter(), xLeave() and xNew() must be supplied */
				rc = JX9_CORRUPT;
				break;
			}
			if( sJx9MPGlobal.pMutexMethods ){
				/* Overwrite the previous mutex subsystem */
				SyMutexRelease(sJx9MPGlobal.pMutexMethods, sJx9MPGlobal.pMutex);
				if( sJx9MPGlobal.pMutexMethods->xGlobalRelease ){
					sJx9MPGlobal.pMutexMethods->xGlobalRelease();
				}
				sJx9MPGlobal.pMutex = 0;
			}
			/* Initialize and install the new mutex subsystem */
			if( pMethods->xGlobalInit ){
				rc = pMethods->xGlobalInit();
				if ( rc != JX9_OK ){
					break;
				}
			}
			/* Create the global mutex */
			sJx9MPGlobal.pMutex = pMethods->xNew(SXMUTEX_TYPE_FAST);
			if( sJx9MPGlobal.pMutex == 0 ){
				/*
				 * If the supplied mutex subsystem is so sick that we are unable to
				 * create a single mutex, there is no much we can do here.
				 */
				if( pMethods->xGlobalRelease ){
					pMethods->xGlobalRelease();
				}
				rc = JX9_CORRUPT;
				break;
			}
			sJx9MPGlobal.pMutexMethods = pMethods;			
			if( sJx9MPGlobal.nThreadingLevel == 0 ){
				/* Set a default threading level */
				sJx9MPGlobal.nThreadingLevel = JX9_THREAD_LEVEL_MULTI; 
			}
#endif
			break;
										   }
		case JX9_LIB_CONFIG_THREAD_LEVEL_SINGLE:
#if defined(JX9_ENABLE_THREADS)
			/* Single thread mode(Only one thread is allowed to play with the library) */
			sJx9MPGlobal.nThreadingLevel = JX9_THREAD_LEVEL_SINGLE;
#endif
			break;
		case JX9_LIB_CONFIG_THREAD_LEVEL_MULTI:
#if defined(JX9_ENABLE_THREADS)
			/* Multi-threading mode (library is thread safe and JX9 engines and virtual machines
			 * may be shared between multiple threads).
			 */
			sJx9MPGlobal.nThreadingLevel = JX9_THREAD_LEVEL_MULTI;
#endif
			break;
		default:
			/* Unknown configuration option */
			rc = JX9_CORRUPT;
			break;
	}
	return rc;
}